

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void integer_suite::test_hundred(void)

{
  char input [4];
  decoder_type decoder;
  long local_170;
  undefined4 local_168;
  value_type local_164 [4];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_164,"100",4);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<4ul>(&local_160,&local_164);
  local_170 = CONCAT44(local_170._4_4_,local_160.current.code);
  local_168 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a0,"void integer_suite::test_hundred()",&local_170,&local_168);
  local_170 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_160);
  local_168 = 100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a1,"void integer_suite::test_hundred()",&local_170,&local_168);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_170 = CONCAT44(local_170._4_4_,local_160.current.code);
  local_168 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a3,"void integer_suite::test_hundred()",&local_170,&local_168);
  return;
}

Assistant:

void test_hundred()
{
    const char input[] = "100";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<std::int64_t>(), 100);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}